

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4_stream.cpp
# Opt level: O0

void __thiscall minibag::LZ4Stream::stopRead(LZ4Stream *this)

{
  string *msg;
  long in_RDI;
  BagException *this_00;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = (BagException *)&stack0xffffffffffffffd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    BagException::BagException(this_00,msg);
    __cxa_throw(msg,&BagException::typeinfo,BagException::~BagException);
  }
  roslz4_decompressEnd((roslz4_stream *)0x184eca);
  return;
}

Assistant:

void LZ4Stream::stopRead() {
    if (!lz4s_.state) {
        throw BagException("cannot close unopened lz4 stream");
    }

    roslz4_decompressEnd(&lz4s_);
}